

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::Regexp(Regexp *this,RegexpOp op,ParseFlags parse_flags)

{
  ParseFlags parse_flags_local;
  RegexpOp op_local;
  Regexp *this_local;
  
  this->op_ = (uint8)op;
  this->simple_ = '\0';
  this->parse_flags_ = (uint16)parse_flags;
  this->ref_ = 1;
  this->nsub_ = 0;
  this->down_ = (Regexp *)0x0;
  (this->field_5).submany_ = (Regexp **)0x0;
  memset(&this->field_7,0,0x10);
  return;
}

Assistant:

Regexp::Regexp(RegexpOp op, ParseFlags parse_flags)
  : op_(static_cast<uint8>(op)),
    simple_(false),
    parse_flags_(static_cast<uint16>(parse_flags)),
    ref_(1),
    nsub_(0),
    down_(NULL) {
  subone_ = NULL;
  memset(the_union_, 0, sizeof the_union_);
}